

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O2

int __thiscall
v_hashmap<substring,_features_*>::init(v_hashmap<substring,_features_*> *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  undefined8 in_RCX;
  undefined8 *in_RDX;
  
  if (ctx < (EVP_PKEY_CTX *)0x400) {
    ctx = (EVP_PKEY_CTX *)0x3ff;
  }
  v_array<v_hashmap<substring,_features_*>::hash_elem>::resize
            ((v_array<v_hashmap<substring,_features_*>::hash_elem> *)(this + 0x18),(size_t)ctx);
  uVar1 = *in_RDX;
  *(undefined8 *)(this + 0x10) = uVar1;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = in_RCX;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  return (int)uVar1;
}

Assistant:

void init(size_t min_size, const V& def, bool (*eq)(const K&, const K&))
  {
    if (min_size < 1023)
      min_size = 1023;
    dat.resize(min_size);  // resize sets to 0 ==> occupied=false

    default_value = def;
    equivalent = nullptr;
    equivalent_no_data = eq;
    eq_data = nullptr;

    last_position = 0;
    num_occupants = 0;
  }